

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClearIniSettings(void)

{
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_conflict *p_Var1;
  ImGuiContext_conflict *pIVar2;
  ImGuiSettingsHandler_conflict *pIVar3;
  int local_14;
  int handler_n;
  ImGuiContext_conflict *g;
  
  pIVar2 = GImGui;
  ImGuiTextBuffer::clear(&GImGui->SettingsIniData);
  for (local_14 = 0; local_14 < (pIVar2->SettingsHandlers).Size; local_14 = local_14 + 1) {
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_14);
    if (pIVar3->ClearAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_conflict *)0x0)
    {
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_14);
      p_Var1 = pIVar3->ClearAllFn;
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&pIVar2->SettingsHandlers,local_14);
      (*p_Var1)(pIVar2,pIVar3);
    }
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ClearAllFn)
            g.SettingsHandlers[handler_n].ClearAllFn(&g, &g.SettingsHandlers[handler_n]);
}